

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_avx2.c
# Opt level: O0

void obmc_variance_w8n(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse,int *sum,
                      int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long in_RCX;
  long in_RDX;
  int in_ESI;
  ulong *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_stack_00000008;
  __m128i v_sqrdiff_d;
  __m128i v_rdiff01_w;
  __m128i v_rdiff1_d;
  __m128i v_rdiff_d;
  __m256i v_rdiff0_d;
  __m256i v_tmp_d;
  __m256i v_sign_d;
  __m256i v_diff0_d;
  __m256i v_pm_d;
  __m256i v_p0_d;
  __m256i v_w_d;
  __m256i v_m_d;
  __m128i v_p_b;
  uint8_t *pre_temp;
  __m128i v_d;
  __m256i v_bias_d;
  __m128i v_sse_d;
  __m128i v_sum_d;
  int height;
  int width;
  int n;
  ulong *local_458;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  int local_3e4;
  int local_3e0;
  int local_3dc;
  ulong *local_3b0;
  undefined4 local_180;
  undefined4 local_160;
  undefined8 uStack_130;
  undefined8 uStack_128;
  
  local_3dc = 0;
  local_3e4 = w;
  local_400 = ZEXT816(0);
  local_410 = ZEXT816(0);
  auVar6 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar6 = vpinsrd_avx(auVar6,0x800,2);
  auVar6 = vpinsrd_avx(auVar6,0x800,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
  auVar1 = vpinsrd_avx(auVar1,0x800,2);
  auVar1 = vpinsrd_avx(auVar1,0x800,3);
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uStack_130 = auVar7._0_8_;
  uStack_128 = auVar7._8_8_;
  local_3b0 = in_RDI;
  do {
    local_3e0 = in_stack_00000008;
    local_458 = local_3b0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *local_458;
      auVar3 = vpmovzxbd_avx2(auVar7);
      auVar3 = vpmaddwd_avx2(auVar3,*(undefined1 (*) [32])(in_RCX + (long)local_3dc * 4));
      auVar3 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDX + (long)local_3dc * 4),auVar3);
      auVar4 = vpsrad_avx2(auVar3,ZEXT416(0x1f));
      auVar5._16_8_ = uStack_130;
      auVar5._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar1;
      auVar5._24_8_ = uStack_128;
      auVar3 = vpaddd_avx2(auVar3,auVar5);
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      auVar3 = vpsrad_avx2(auVar3,ZEXT416(0xc));
      auVar7 = vpackssdw_avx(auVar3._0_16_,auVar3._16_16_);
      auVar2 = vpmaddwd_avx(auVar7,auVar7);
      auVar7 = vpaddd_avx(local_400,auVar3._0_16_);
      local_400 = vpaddd_avx(auVar7,auVar3._16_16_);
      local_410 = vpaddd_avx(local_410,auVar2);
      local_458 = local_458 + 1;
      local_3dc = local_3dc + 8;
      local_3e0 = local_3e0 + -8;
    } while (0 < local_3e0);
    local_3b0 = (ulong *)((long)local_3b0 + (long)in_ESI);
    local_3e4 = local_3e4 + -1;
  } while (0 < local_3e4);
  auVar6 = vphaddd_avx(local_400,local_410);
  auVar6 = vphaddd_avx(auVar6,auVar6);
  local_160 = auVar6._0_4_;
  *in_R9 = local_160;
  auVar6 = vpsrldq_avx(auVar6,4);
  local_180 = auVar6._0_4_;
  *in_R8 = local_180;
  return;
}

Assistant:

static inline void obmc_variance_w8n(const uint8_t *pre, const int pre_stride,
                                     const int32_t *wsrc, const int32_t *mask,
                                     unsigned int *const sse, int *const sum,
                                     const int w, const int h) {
  int n = 0, width, height = h;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);
  __m128i v_d;
  const uint8_t *pre_temp;
  assert(w >= 8);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));
  do {
    width = w;
    pre_temp = pre;
    do {
      const __m128i v_p_b = _mm_loadl_epi64((const __m128i *)pre_temp);
      const __m256i v_m_d = _mm256_loadu_si256((__m256i const *)(mask + n));
      const __m256i v_w_d = _mm256_loadu_si256((__m256i const *)(wsrc + n));
      const __m256i v_p0_d = _mm256_cvtepu8_epi32(v_p_b);

      // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
      // boundaries. We use pmaddwd, as it has lower latency on Haswell
      // than pmulld but produces the same result with these inputs.
      const __m256i v_pm_d = _mm256_madd_epi16(v_p0_d, v_m_d);
      const __m256i v_diff0_d = _mm256_sub_epi32(v_w_d, v_pm_d);

      const __m256i v_sign_d = _mm256_srai_epi32(v_diff0_d, 31);
      const __m256i v_tmp_d =
          _mm256_add_epi32(_mm256_add_epi32(v_diff0_d, v_bias_d), v_sign_d);
      const __m256i v_rdiff0_d = _mm256_srai_epi32(v_tmp_d, 12);
      const __m128i v_rdiff_d = _mm256_castsi256_si128(v_rdiff0_d);
      const __m128i v_rdiff1_d = _mm256_extracti128_si256(v_rdiff0_d, 1);

      const __m128i v_rdiff01_w = _mm_packs_epi32(v_rdiff_d, v_rdiff1_d);
      const __m128i v_sqrdiff_d = _mm_madd_epi16(v_rdiff01_w, v_rdiff01_w);

      v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
      v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff1_d);
      v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

      pre_temp += 8;
      n += 8;
      width -= 8;
    } while (width > 0);
    pre += pre_stride;
    height -= 1;
  } while (height > 0);
  v_d = _mm_hadd_epi32(v_sum_d, v_sse_d);
  v_d = _mm_hadd_epi32(v_d, v_d);
  *sum = _mm_cvtsi128_si32(v_d);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(v_d, 4));
}